

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O0

void __thiscall OpenMPOrderedDirective::OpenMPOrderedDirective(OpenMPOrderedDirective *this)

{
  OpenMPOrderedDirective *this_local;
  
  OpenMPDirective::OpenMPDirective(&this->super_OpenMPDirective,OMPD_ordered,Lang_unknown,0,0);
  return;
}

Assistant:

OpenMPOrderedDirective() : OpenMPDirective(OMPD_ordered) { }